

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O1

void __thiscall OpenMD::CubicSpline::getValueAt(CubicSpline *this,RealType *t,RealType *v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  if (this->generated == false) {
    generate(this);
  }
  if (this->isUniform == true) {
    this->j = (int)((*t - *(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) * this->dx);
  }
  else {
    iVar1 = this->n;
    this->j = iVar1 + -1;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        if (*t < (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4]) {
          this->j = (int)lVar4 + -1;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
  }
  iVar1 = this->j;
  iVar2 = this->n + -1;
  if (iVar1 < this->n) {
    iVar2 = iVar1;
  }
  iVar3 = 0;
  if (-1 < iVar1) {
    iVar3 = iVar2;
  }
  this->j = iVar3;
  dVar5 = *t - (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
  this->dt = dVar5;
  *v = (((this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar3] * dVar5 +
        (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3]) * dVar5 +
       (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start[iVar3]) * dVar5 +
       (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iVar3];
  return;
}

Assistant:

void CubicSpline::getValueAt(const RealType& t, RealType& v) {
    // Evaluate the spline at t using coefficients
    //
    // Input parameters
    //   t = point where spline is to be evaluated.
    // Output:
    //   value of spline at t.

    if (!generated) generate();

    //  Find the interval ( x[j], x[j+1] ) that contains or is nearest
    //  to t.

    if (isUniform) {
      j = int((t - x_[0]) * dx);

    } else {
      j = n - 1;

      for (int i = 0; i < n; i++) {
        if (t < x_[i]) {
          j = i - 1;
          break;
        }
      }
    }

    j = std::clamp(j, 0, n - 1);

    //  Evaluate the cubic polynomial.

    dt = t - x_[j];
    v  = y_[j] + dt * (b[j] + dt * (c[j] + dt * d[j]));
  }